

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O2

void __thiscall miniros::ServiceClient::deserializeFailed(ServiceClient *this,exception *e)

{
  Level level;
  void *logger_handle;
  undefined8 uVar1;
  allocator<char> local_39;
  string local_38;
  
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (deserializeFailed::loc.initialized_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"miniros.unknown_package",&local_39);
    console::initializeLogLocation(&deserializeFailed::loc,&local_38,Error);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (deserializeFailed::loc.level_ != Error) {
    console::setLogLocationLevel(&deserializeFailed::loc,Error);
    console::checkLogLocationEnabled(&deserializeFailed::loc);
  }
  logger_handle = deserializeFailed::loc.logger_;
  level = deserializeFailed::loc.level_;
  if (deserializeFailed::loc.logger_enabled_ == true) {
    uVar1 = (**(code **)(*(long *)e + 0x10))();
    console::print((FilterBase *)0x0,logger_handle,level,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client.cpp"
                   ,0xd8,"void miniros::ServiceClient::deserializeFailed(const std::exception &)",
                   "Exception thrown while while deserializing service call: %s",uVar1);
  }
  return;
}

Assistant:

void ServiceClient::deserializeFailed(const std::exception& e)
{
  MINIROS_ERROR("Exception thrown while while deserializing service call: %s", e.what());
}